

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::DeleteString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pString)

{
  size_t *psVar1;
  char *pcVar2;
  _List_node_base *p_Var3;
  
  if ((a_pString < this->m_pData) || (this->m_pData + this->m_uDataLen <= a_pString)) {
    p_Var3 = (_List_node_base *)&this->m_strings;
    while (p_Var3 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                       *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)&this->m_strings) {
      pcVar2 = (char *)p_Var3[1]._M_next;
      if (pcVar2 == a_pString) {
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        psVar1 = &(this->m_strings).
                  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var3);
        return;
      }
    }
  }
  return;
}

Assistant:

void
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::DeleteString(
    const SI_CHAR * a_pString
    )
{
    // strings may exist either inside the data block, or they will be
    // individually allocated and stored in m_strings. We only physically
    // delete those stored in m_strings.
    if (a_pString < m_pData || a_pString >= m_pData + m_uDataLen) {
        typename TNamesDepend::iterator i = m_strings.begin();
        for (;i != m_strings.end(); ++i) {
            if (a_pString == i->pItem) {
                delete[] const_cast<SI_CHAR*>(i->pItem);
                m_strings.erase(i);
                break;
            }
        }
    }
}